

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  pointer __s;
  byte bVar2;
  bool bVar3;
  pointer this_01;
  pointer pcVar4;
  string *psVar5;
  undefined8 uVar6;
  pointer this_02;
  container_type *includeDirs_00;
  undefined8 uVar7;
  cmTarget *this_03;
  cmGeneratorTarget *this_04;
  cmLocalGenerator *this_05;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  cmStateSnapshot local_718;
  cmStateDirectory local_700;
  undefined1 local_6d8 [8];
  cmLinkLineComputer linkLineComputer;
  cmLocalGenerator *lg_1;
  cmGeneratorTarget *gtgt;
  string linkFlags;
  string flags;
  string linkPath;
  string frameworkPath;
  string linkLibs;
  allocator<char> local_5c1;
  string local_5c0;
  undefined1 local_5a0 [8];
  string buildType;
  string *lib;
  iterator __end5;
  iterator __begin5;
  cmList *__range5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  iterator local_538;
  size_type local_530;
  undefined1 local_528 [8];
  cmList libList;
  string local_508;
  string local_4e8 [8];
  string libs;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  cmTarget *local_478;
  cmTarget *tgt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  char *targetName;
  allocator<char> local_419;
  string local_418;
  string local_3f8 [8];
  string definitions;
  undefined1 local_3b8 [8];
  string includeFlags;
  value_type *lg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  iterator local_368;
  size_type local_360;
  undefined1 local_358 [8];
  cmList includeDirs;
  string local_338;
  string local_318 [8];
  string includes;
  allocator<char> local_291;
  string local_290;
  byte local_26a;
  allocator<char> local_269;
  undefined1 local_268 [6];
  bool quiet;
  byte local_242;
  allocator<char> local_241;
  undefined1 local_240 [6];
  bool packageFound;
  string local_220 [8];
  string packageName;
  string local_1f8;
  string local_1d8 [8];
  string mode;
  string local_1b0;
  undefined1 local_190 [8];
  string language;
  undefined1 local_160 [8];
  string systemFile;
  cmMakefile *mf;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> local_128;
  __single_object mfu;
  cmStateDirectory local_100;
  string local_d8;
  cmStateDirectory local_b8;
  undefined1 local_90 [8];
  cmStateSnapshot snapshot;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_70;
  string local_68;
  string local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  local_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  snapshot.Position.Position = (PositionType)this;
  std::make_unique<cmGlobalGenerator,cmake*>((cmake **)&local_70);
  SetGlobalGenerator(this,&local_70);
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            (&local_70);
  GetCurrentSnapshot((cmStateSnapshot *)local_90,this);
  cmStateSnapshot::GetDirectory(&local_b8,(cmStateSnapshot *)local_90);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateDirectory::SetCurrentBinary(&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmStateSnapshot::GetDirectory(&local_100,(cmStateSnapshot *)local_90);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateDirectory::SetCurrentSource(&local_100,(string *)&mfu);
  std::__cxx11::string::~string((string *)&mfu);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_90);
  mf = (cmMakefile *)GetGlobalGenerator(this);
  std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)&local_128,(cmStateSnapshot *)&mf);
  this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(&local_128);
  pcVar4 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator->
                     (&this->GlobalGenerator);
  this_00 = (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
            ((long)&systemFile.field_2 + 8);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::unique_ptr(this_00,&local_128);
  cmGlobalGenerator::AddMakefile(pcVar4,this_00);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
             ((long)&systemFile.field_2 + 8));
  cmMakefile::SetArgcArgv(this_01,local_18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&language.field_2 + 8),
             "CMakeFindPackageMode.cmake");
  cmMakefile::GetModulesFile_abi_cxx11_((string *)local_160,this_01,stack0xfffffffffffffe90);
  cmMakefile::ReadListFile(this_01,(string *)local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"LANGUAGE",(allocator<char> *)(mode.field_2._M_local_buf + 0xf));
  psVar5 = cmMakefile::GetSafeDefinition(this_01,&local_1b0);
  std::__cxx11::string::string((string *)local_190,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)(mode.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"MODE",(allocator<char> *)(packageName.field_2._M_local_buf + 0xf)
            );
  psVar5 = cmMakefile::GetSafeDefinition(this_01,&local_1f8);
  std::__cxx11::string::string(local_1d8,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)(packageName.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_240,"NAME",&local_241);
  psVar5 = cmMakefile::GetSafeDefinition(this_01,(string *)local_240);
  std::__cxx11::string::string(local_220,(string *)psVar5);
  std::__cxx11::string::~string((string *)local_240);
  std::allocator<char>::~allocator(&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_268,"PACKAGE_FOUND",&local_269)
  ;
  bVar3 = cmMakefile::IsOn(this_01,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  std::allocator<char>::~allocator(&local_269);
  local_242 = bVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"PACKAGE_QUIET",&local_291);
  bVar3 = cmMakefile::IsOn(this_01,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  local_26a = bVar3;
  if ((local_242 & 1) == 0) {
    if (!bVar3) {
      uVar6 = std::__cxx11::string::c_str();
      printf("%s not found.\n",uVar6);
    }
  }
  else {
    _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view(local_1d8);
    bVar8 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("EXIST",5);
    bVar3 = std::operator==(_Var1,bVar8);
    if (bVar3) {
      if ((local_26a & 1) == 0) {
        uVar6 = std::__cxx11::string::c_str();
        printf("%s found.\n",uVar6);
      }
    }
    else {
      _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view(local_1d8);
      bVar8 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("COMPILE",7);
      includes.field_2._8_8_ = bVar8._M_len;
      bVar3 = std::operator==(_Var1,bVar8);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_338,"PACKAGE_INCLUDE_DIRS",
                   (allocator<char> *)
                   ((long)&includeDirs.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        psVar5 = cmMakefile::GetSafeDefinition(this_01,&local_338);
        std::__cxx11::string::string(local_318,(string *)psVar5);
        std::__cxx11::string::~string((string *)&local_338);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&includeDirs.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::string((string *)&local_388,local_318);
        local_368 = &local_388;
        local_360 = 1;
        init_00._M_len = 1;
        init_00._M_array = local_368;
        cmList::cmList((cmList *)local_358,init_00);
        local_880 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_368;
        do {
          local_880 = local_880 + -1;
          std::__cxx11::string::~string((string *)local_880);
        } while (local_880 != &local_388);
        pcVar4 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                 operator->(&this->GlobalGenerator);
        cmGlobalGenerator::CreateGenerationObjects(pcVar4,AllTargets);
        pcVar4 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                 operator->(&this->GlobalGenerator);
        includeFlags.field_2._8_8_ =
             std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::operator[](&pcVar4->LocalGenerators,0);
        this_02 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                  operator->((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *
                             )includeFlags.field_2._8_8_);
        includeDirs_00 = cmList::operator_cast_to_vector_((cmList *)local_358);
        std::__cxx11::string::string((string *)(definitions.field_2._M_local_buf + 8));
        cmLocalGenerator::GetIncludeFlags
                  ((string *)local_3b8,this_02,includeDirs_00,(cmGeneratorTarget *)0x0,
                   (string *)local_190,(string *)(definitions.field_2._M_local_buf + 8),false);
        std::__cxx11::string::~string((string *)(definitions.field_2._M_local_buf + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"PACKAGE_DEFINITIONS",&local_419);
        psVar5 = cmMakefile::GetSafeDefinition(this_01,&local_418);
        std::__cxx11::string::string(local_3f8,(string *)psVar5);
        std::__cxx11::string::~string((string *)&local_418);
        std::allocator<char>::~allocator(&local_419);
        uVar6 = std::__cxx11::string::c_str();
        uVar7 = std::__cxx11::string::c_str();
        printf("%s %s\n",uVar6,uVar7);
        std::__cxx11::string::~string(local_3f8);
        std::__cxx11::string::~string((string *)local_3b8);
        cmList::~cmList((cmList *)local_358);
        std::__cxx11::string::~string(local_318);
      }
      else {
        _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view(local_1d8);
        bVar8 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("LINK",4);
        bVar3 = std::operator==(_Var1,bVar8);
        if (bVar3) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_c54044;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tgt);
          __s = srcs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_498,(char *)__s,&local_499);
          this_03 = cmMakefile::AddExecutable
                              (this_01,&local_498,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&tgt,true);
          std::__cxx11::string::~string((string *)&local_498);
          std::allocator<char>::~allocator(&local_499);
          local_478 = this_03;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4c0,"LINKER_LANGUAGE",
                     (allocator<char> *)(libs.field_2._M_local_buf + 0xf));
          cmTarget::SetProperty(this_03,&local_4c0,(string *)local_190);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::allocator<char>::~allocator((allocator<char> *)(libs.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_508,"PACKAGE_LIBRARIES",
                     (allocator<char> *)
                     ((long)&libList.Values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          psVar5 = cmMakefile::GetSafeDefinition(this_01,&local_508);
          std::__cxx11::string::string(local_4e8,(string *)psVar5);
          std::__cxx11::string::~string((string *)&local_508);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&libList.Values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::__cxx11::string::string((string *)&local_558,local_4e8);
          local_538 = &local_558;
          local_530 = 1;
          init._M_len = 1;
          init._M_array = local_538;
          cmList::cmList((cmList *)local_528,init);
          local_958 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_538;
          do {
            local_958 = local_958 + -1;
            std::__cxx11::string::~string((string *)local_958);
          } while (local_958 != &local_558);
          __end5 = cmList::begin_abi_cxx11_((cmList *)local_528);
          lib = (string *)cmList::end_abi_cxx11_((cmList *)local_528);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&lib), bVar3) {
            buildType.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end5);
            cmTarget::AddLinkLibrary
                      (local_478,this_01,(string *)buildType.field_2._8_8_,GENERAL_LibraryType);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end5);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c0,"CMAKE_BUILD_TYPE",&local_5c1);
          psVar5 = cmMakefile::GetSafeDefinition(this_01,&local_5c0);
          std::__cxx11::string::string((string *)local_5a0,(string *)psVar5);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::allocator<char>::~allocator(&local_5c1);
          cmsys::SystemTools::UpperCase((string *)((long)&linkLibs.field_2 + 8),(string *)local_5a0)
          ;
          std::__cxx11::string::operator=
                    ((string *)local_5a0,(string *)(linkLibs.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(frameworkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(flags.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&gtgt);
          pcVar4 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                   operator->(&this->GlobalGenerator);
          cmGlobalGenerator::CreateGenerationObjects(pcVar4,AllTargets);
          pcVar4 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                   operator->(&this->GlobalGenerator);
          psVar5 = cmTarget::GetName_abi_cxx11_(local_478);
          this_04 = cmGlobalGenerator::FindGeneratorTarget(pcVar4,psVar5);
          this_05 = cmGeneratorTarget::GetLocalGenerator(this_04);
          linkLineComputer._56_8_ = this_05;
          cmLocalGenerator::GetStateSnapshot(&local_718,this_05);
          cmStateSnapshot::GetDirectory(&local_700,&local_718);
          cmLinkLineComputer::cmLinkLineComputer
                    ((cmLinkLineComputer *)local_6d8,&this_05->super_cmOutputConverter,&local_700);
          cmLocalGenerator::GetTargetFlags
                    ((cmLocalGenerator *)linkLineComputer._56_8_,(cmLinkLineComputer *)local_6d8,
                     (string *)local_5a0,(string *)((long)&frameworkPath.field_2 + 8),
                     (string *)((long)&linkFlags.field_2 + 8),(string *)&gtgt,
                     (string *)((long)&linkPath.field_2 + 8),(string *)((long)&flags.field_2 + 8),
                     this_04);
          std::operator+(&local_758,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&linkPath.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&flags.field_2 + 8));
          std::operator+(&local_738,&local_758,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&frameworkPath.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(frameworkPath.field_2._M_local_buf + 8),(string *)&local_738);
          std::__cxx11::string::~string((string *)&local_738);
          std::__cxx11::string::~string((string *)&local_758);
          uVar6 = std::__cxx11::string::c_str();
          printf("%s\n",uVar6);
          cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)local_6d8);
          std::__cxx11::string::~string((string *)&gtgt);
          std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_5a0);
          cmList::~cmList((cmList *)local_528);
          std::__cxx11::string::~string(local_4e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tgt);
        }
      }
    }
  }
  bVar2 = local_242;
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)local_160);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&local_128);
  return (bool)(bVar2 & 1);
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  this->SetGlobalGenerator(cm::make_unique<cmGlobalGenerator>(this));

  cmStateSnapshot snapshot = this->GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary(
    cmSystemTools::GetCurrentWorkingDirectory());
  snapshot.GetDirectory().SetCurrentSource(
    cmSystemTools::GetCurrentWorkingDirectory());
  // read in the list file to fill the cache
  snapshot.SetDefaultDefinitions();
  auto mfu = cm::make_unique<cmMakefile>(this->GetGlobalGenerator(), snapshot);
  cmMakefile* mf = mfu.get();
  this->GlobalGenerator->AddMakefile(std::move(mfu));

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile);

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound) {
    if (!quiet) {
      printf("%s not found.\n", packageName.c_str());
    }
  } else if (mode == "EXIST"_s) {
    if (!quiet) {
      printf("%s found.\n", packageName.c_str());
    }
  } else if (mode == "COMPILE"_s) {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    cmList includeDirs{ includes };

    this->GlobalGenerator->CreateGenerationObjects();
    const auto& lg = this->GlobalGenerator->LocalGenerators[0];
    std::string includeFlags =
      lg->GetIncludeFlags(includeDirs, nullptr, language, std::string());

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
  } else if (mode == "LINK"_s) {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language);

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    cmList libList{ libs };
    for (std::string const& lib : libList) {
      tgt->AddLinkLibrary(*mf, lib, GENERAL_LibraryType);
    }

    std::string buildType = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
    buildType = cmSystemTools::UpperCase(buildType);

    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    this->GlobalGenerator->CreateGenerationObjects();
    cmGeneratorTarget* gtgt =
      this->GlobalGenerator->FindGeneratorTarget(tgt->GetName());
    cmLocalGenerator* lg = gtgt->GetLocalGenerator();
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, buildType, linkLibs, flags,
                       linkFlags, frameworkPath, linkPath, gtgt);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str());

    /*    if ( use_win32 )
          {
          tgt->SetProperty("WIN32_EXECUTABLE", "ON");
          }
        if ( use_macbundle)
          {
          tgt->SetProperty("MACOSX_BUNDLE", "ON");
          }*/
  }

  return packageFound;
}